

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O3

void reset_room(ROOM_INDEX_DATA *pRoom)

{
  byte *pbVar1;
  ushort uVar2;
  undefined2 uVar3;
  EXIT_DATA *pEVar4;
  int iVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  OBJ_INDEX_DATA *pOVar10;
  OBJ_INDEX_DATA *pOVar11;
  obj_data *poVar12;
  OBJ_DATA *pOVar13;
  char *pcVar14;
  ROOM_INDEX_DATA *pRVar15;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *pCVar16;
  ROOM_INDEX_DATA *pRVar17;
  CHAR_DATA *pCVar18;
  short *args;
  short sVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  long lVar24;
  RESET_DATA *pRVar25;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  
  if (pRoom != (ROOM_INDEX_DATA *)0x0) {
    if (pRoom->trap != (TRAP_DATA *)0x0) {
      pRoom->trap->armed = true;
    }
    pRVar25 = pRoom->reset_first;
    if (pRVar25 != (RESET_DATA *)0x0) {
      bVar6 = true;
      iVar5 = 0;
      pCVar16 = (char_data *)0x0;
      do {
        switch(pRVar25->command) {
        case 'D':
          pRVar15 = get_room_index(0);
          if (pRVar15 == (ROOM_INDEX_DATA *)0x0) {
            args = &pRVar25->arg1;
            sVar23 = 0x1d;
            pcVar14 = "Reset_area: \'D\': bad vnum {}.";
            goto LAB_0012e365;
          }
          pEVar4 = pRVar15->exit[pRVar25->arg2];
          if (pEVar4 != (EXIT_DATA *)0x0) {
            uVar22 = pEVar4->exit_info[0];
            pEVar4->exit_info[0] = uVar22 | 1;
            sVar19 = pRVar25->arg3;
            bVar6 = true;
            if (sVar19 == 2) {
              uVar22 = uVar22 | 7;
            }
            else {
              if (sVar19 != 1) {
                if (sVar19 == 0) {
                  pEVar4->exit_info[0] = uVar22 & 0xfffffffffffffff9 | 1;
                }
                break;
              }
              uVar22 = uVar22 & 0xfffffffffffffff8 | 3;
            }
            pEVar4->exit_info[0] = uVar22;
          }
          break;
        case 'E':
        case 'G':
          args = &pRVar25->arg1;
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            sVar23 = 0x24;
            pcVar14 = "Reset_room: \'E\' or \'G\': bad vnum {}.";
            goto LAB_0012e365;
          }
          if (!bVar6) break;
          if (pCVar16 == (char_data *)0x0) {
            fmt_04._M_str = "Reset_room: \'E\' or \'G\': null mob for vnum {}.";
            fmt_04._M_len = 0x2d;
            CLogger::Warn<short&>((CLogger *)std::ios::widen,fmt_04,args);
            pCVar16 = (CHAR_DATA *)0x0;
LAB_0012e342:
            bVar6 = false;
            break;
          }
          if (pCVar16->pIndexData->pShop == (SHOP_DATA *)0x0) {
            if (pOVar10->limtotal <= pOVar10->limcount && 0 < pOVar10->limtotal) break;
            uVar22 = number_mm();
            if (((uint)uVar22 & 3) == 3) {
              iVar8 = iVar5 + 1;
            }
            else {
              iVar8 = iVar5;
              if ((uVar22 & 3) == 0) {
                iVar8 = iVar5 + -1;
              }
            }
            if (iVar8 < 2) {
              iVar8 = 1;
            }
            if (0x31 < iVar8) {
              iVar8 = 0x32;
            }
            pOVar13 = create_object(pOVar10,iVar8);
            pcVar14 = (char *)palloc_string("none");
            pOVar13->owner = pcVar14;
            goto LAB_0012e64a;
          }
          iVar8 = 0;
          if (pOVar10->new_format != false) goto switchD_0012ddb4_caseD_6;
          iVar8 = 0;
          switch(pOVar10->item_type) {
          case 2:
          case 10:
switchD_0012ddb4_caseD_2:
            iVar20 = 0x35;
            lVar21 = 1;
            do {
              if (0 < (long)pOVar10->value[lVar21]) {
                lVar24 = 4;
                do {
                  if (*(short *)(&skill_table + lVar24 * 2 + (long)pOVar10->value[lVar21] * 0x60) <=
                      iVar20) {
                    iVar20 = (int)*(short *)(&skill_table +
                                            lVar24 * 2 + (long)pOVar10->value[lVar21] * 0x60);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 0x10);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != 5);
            iVar8 = iVar20 * 3 + 3;
            if (-1 < iVar20 * 3) {
              iVar8 = iVar20 * 3;
            }
            iVar8 = iVar8 >> 2;
            if (iVar8 < 3) {
              iVar8 = 2;
            }
            iVar8 = iVar8 + -2;
            break;
          case 3:
            do {
              lVar21 = number_mm();
              uVar9 = (uint)lVar21 & 0xf;
            } while (10 < uVar9);
            goto LAB_0012e1d5;
          case 4:
            do {
              lVar21 = number_mm();
              uVar9 = (uint)lVar21 & 0xf;
            } while (10 < uVar9);
            iVar8 = uVar9 + 0xf;
            break;
          case 5:
            do {
              lVar21 = number_mm();
              uVar9 = (uint)lVar21 & 0xf;
            } while (10 < uVar9);
            goto LAB_0012e1c0;
          case 6:
          case 7:
            break;
          case 8:
            do {
              lVar21 = number_mm();
              uVar9 = (uint)lVar21 & 0xf;
            } while (10 < uVar9);
LAB_0012e1d5:
            iVar8 = uVar9 + 10;
            break;
          case 9:
            do {
              lVar21 = number_mm();
              uVar9 = (uint)lVar21 & 0xf;
            } while (10 < uVar9);
LAB_0012e1c0:
            iVar8 = uVar9 + 5;
            break;
          default:
            if (pOVar10->item_type == 0x1a) goto switchD_0012ddb4_caseD_2;
          }
switchD_0012ddb4_caseD_6:
          pOVar13 = create_object(pOVar10,iVar8);
          pcVar14 = (char *)palloc_string("none");
          pOVar13->owner = pcVar14;
          if (pOVar13->pIndexData->limtotal == 0) {
            pbVar1 = (byte *)((long)pOVar13->extra_flags + 1);
            *pbVar1 = *pbVar1 | 0x20;
          }
LAB_0012e64a:
          obj_to_char(pOVar13,pCVar16);
          bVar6 = true;
          if (pRVar25->command == 'E') {
            sVar19 = pRVar25->arg3;
            if (sVar19 == 0x12) {
              lVar21 = get_eq_char(pCVar16,0x10);
              if (lVar21 != 0) {
LAB_0012e6c3:
                sVar19 = pRVar25->arg3;
                goto LAB_0012e6db;
              }
LAB_0012e6cb:
              iVar8 = 0x10;
            }
            else {
              if (sVar19 == 0x10) {
                poVar12 = (obj_data *)get_eq_char(pCVar16,0x10);
                if (poVar12 == (obj_data *)0x0) goto LAB_0012e6c3;
                unequip_char(pCVar16,poVar12,true);
                equip_char(pCVar16,poVar12,0x12,true);
                goto LAB_0012e6cb;
              }
LAB_0012e6db:
              iVar8 = (int)sVar19;
            }
            equip_char(pCVar16,pOVar13,iVar8,true);
          }
          break;
        case 'F':
          if (pCVar16 == (char_data *)0x0) {
            pCVar16 = (CHAR_DATA *)0x0;
          }
          else {
            for (pCVar18 = pCVar16->in_room->people; pCVar18 != (char_data *)0x0;
                pCVar18 = pCVar18->next_in_room) {
              cVar7 = is_npc(pCVar18);
              if ((cVar7 != '\0') && (pRVar25->arg2 == pCVar18->pIndexData->vnum)) {
                if (bVar6) {
                  add_follower(pCVar16,pCVar18);
                  pCVar16->leader = pCVar18;
                }
                break;
              }
            }
          }
          break;
        default:
          fmt._M_str = "Reset_area: bad command {}.";
          fmt._M_len = 0x1b;
          CLogger::Warn<char&>((CLogger *)std::ios::widen,fmt,&pRVar25->command);
          break;
        case 'M':
          pMobIndex = get_mob_index(0);
          if (pMobIndex == (MOB_INDEX_DATA *)0x0) {
            args = &pRVar25->arg1;
            sVar23 = 0x1d;
            pcVar14 = "Reset_area: \'M\': bad vnum {}.";
          }
          else {
            pRVar15 = get_room_index(0);
            if (pRVar15 != (ROOM_INDEX_DATA *)0x0) {
              iVar8 = 0;
              if (pRVar25->arg2 <= pMobIndex->count) goto LAB_0012e342;
              pCVar18 = pRVar15->people;
              if (pCVar18 != (CHAR_DATA *)0x0) {
                iVar8 = 0;
                do {
                  if ((pCVar18->pIndexData == pMobIndex) &&
                     (iVar8 = iVar8 + 1, pRVar25->arg4 <= iVar8)) {
                    bVar6 = false;
                    break;
                  }
                  pCVar18 = pCVar18->next_in_room;
                } while (pCVar18 != (CHAR_DATA *)0x0);
              }
              if (iVar8 < pRVar25->arg4) {
                pCVar16 = create_mobile(pMobIndex);
                cVar7 = room_is_dark(pRoom);
                if (cVar7 != '\0') {
                  pbVar1 = (byte *)((long)pCVar16->affected_by + 1);
                  *pbVar1 = *pbVar1 | 2;
                }
                pRVar17 = get_room_index(0);
                if ((pRVar17 != (ROOM_INDEX_DATA *)0x0) && ((pRVar17->room_flags[0] & 0x1000) != 0))
                {
                  pbVar1 = (byte *)((long)pCVar16->act + 1);
                  *pbVar1 = *pbVar1 | 1;
                }
                pCVar16->zone = pRVar15->area;
                char_to_room(pCVar16,pRoom);
                uVar2 = pCVar16->level;
                bVar6 = true;
                iVar5 = 0;
                if (1 < (short)uVar2) {
                  iVar5 = (short)uVar2 + -2;
                  if (0x34 < uVar2) {
                    iVar5 = 0x32;
                  }
                }
              }
              break;
            }
            args = &pRVar25->arg3;
            sVar23 = 0x1d;
            pcVar14 = "Reset_area: \'R\': bad vnum {}.";
          }
          goto LAB_0012e365;
        case 'O':
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            fmt_00._M_str = "Reset_room: \'O\' 1 : bad vnum {}";
            fmt_00._M_len = 0x1f;
            CLogger::Warn<short&>((CLogger *)std::ios::widen,fmt_00,&pRVar25->arg1);
          }
          else {
            pRVar15 = get_room_index(0);
            if (pRVar15 != (ROOM_INDEX_DATA *)0x0) {
              for (pOVar13 = pRVar15->contents; pOVar13 != (obj_data *)0x0;
                  pOVar13 = pOVar13->next_content) {
                if (((pOVar13->pIndexData->vnum == pOVar10->vnum) &&
                    (cVar7 = is_obj_stat(pOVar13,0x21), cVar7 == '\0')) &&
                   ((cVar7 = is_obj_stat(pOVar13,0x18), cVar7 == '\0' &&
                    (((cVar7 = is_obj_stat(pOVar13,0x17), cVar7 == '\0' &&
                      (pOVar13->item_type == 0xf)) && (pOVar13->contains == (OBJ_DATA *)0x0)))))) {
                  extract_obj(pOVar13);
                }
              }
              if (pOVar10->limcount < pOVar10->limtotal || pOVar10->limtotal < 1) {
                iVar8 = count_obj_list(pOVar10,pRVar15->contents);
                if (iVar8 < 1) {
                  uVar22 = number_mm();
                  if (((uint)uVar22 & 3) == 3) {
                    iVar8 = iVar5 + 1;
                  }
                  else {
                    iVar8 = iVar5;
                    if ((uVar22 & 3) == 0) {
                      iVar8 = iVar5 + -1;
                    }
                  }
                  if (iVar8 < 2) {
                    iVar8 = 1;
                  }
                  if (0x31 < iVar8) {
                    iVar8 = 0x32;
                  }
                  pOVar13 = create_object(pOVar10,iVar8);
                  pOVar13->cost = 0;
                  pcVar14 = (char *)palloc_string("none");
                  pOVar13->owner = pcVar14;
                  pcVar14 = (char *)palloc_string("someone a long long time ago");
                  pOVar13->talked = pcVar14;
                  obj_to_room(pOVar13,pRoom);
                  bVar6 = true;
                }
                else {
                  bVar6 = false;
                }
              }
              else {
LAB_0012e1fe:
                bVar6 = false;
              }
              break;
            }
            fmt_02._M_str = "Reset_room: \'O\' 2 : bad vnum {}.";
            fmt_02._M_len = 0x20;
            CLogger::Warn<short&>((CLogger *)std::ios::widen,fmt_02,&pRVar25->arg3);
          }
          fmt_03._M_str = "{} {} {} {}";
          fmt_03._M_len = 0xb;
          CLogger::Warn<short&,short&,short&,short&>
                    ((CLogger *)std::ios::widen,fmt_03,&pRVar25->arg1,&pRVar25->arg2,&pRVar25->arg3,
                     &pRVar25->arg4);
          break;
        case 'P':
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            args = &pRVar25->arg1;
          }
          else {
            pOVar11 = get_obj_index(0);
            if (pOVar11 != (OBJ_INDEX_DATA *)0x0) {
              uVar3 = pRVar25->arg2;
              sVar19 = uVar3;
              if (uVar3 == -1) {
                sVar19 = 999;
              }
              if (0x32 < (short)uVar3) {
                sVar19 = 6;
              }
              if ((((1 < pRoom->area->nplayer) ||
                   (poVar12 = (obj_data *)get_obj_type(pOVar11), poVar12 == (obj_data *)0x0)) ||
                  ((poVar12->in_room == (ROOM_INDEX_DATA *)0x0 && (!bVar6)))) ||
                 (((0 < pOVar10->limtotal && (pOVar10->limtotal <= pOVar10->limcount)) ||
                  (sVar19 <= pOVar10->count)))) goto LAB_0012e342;
              iVar8 = count_obj_list(pOVar10,poVar12->contains);
              if (pRVar25->arg4 < iVar8) goto LAB_0012e1fe;
              if (iVar8 < pRVar25->arg4) {
                do {
                  iVar20 = (int)poVar12->level;
                  uVar22 = number_mm();
                  if (((uint)uVar22 & 3) == 3) {
                    iVar20 = iVar20 + 1;
                  }
                  else if ((uVar22 & 3) == 0) {
                    iVar20 = iVar20 + -1;
                  }
                  if (iVar20 < 2) {
                    iVar20 = 1;
                  }
                  pOVar13 = create_object(pOVar10,iVar20);
                  pcVar14 = (char *)palloc_string("none");
                  pOVar13->owner = pcVar14;
                  obj_to_obj(pOVar13,poVar12);
                } while ((pOVar10->limtotal < 1 || pOVar10->limcount < pOVar10->limtotal) &&
                        (iVar8 = iVar8 + 1, iVar8 < pRVar25->arg4));
              }
              poVar12->value[1] = poVar12->pIndexData->value[1];
              bVar6 = true;
              break;
            }
            args = &pRVar25->arg3;
          }
          sVar23 = 0x1d;
          pcVar14 = "Reset_room: \'P\': bad vnum {}.";
LAB_0012e365:
          fmt_05._M_str = pcVar14;
          fmt_05._M_len = sVar23;
          CLogger::Warn<short&>((CLogger *)std::ios::widen,fmt_05,args);
          break;
        case 'R':
          pRVar15 = get_room_index(0);
          if (pRVar15 == (ROOM_INDEX_DATA *)0x0) {
            fmt_01._M_str = "Reset_room: \'R\': bad vnum {}.";
            fmt_01._M_len = 0x1d;
            CLogger::Warn<short&>((CLogger *)std::ios::widen,fmt_01,&pRVar25->arg1);
          }
          else if (1 < pRVar25->arg2) {
            uVar22 = (ulong)((int)pRVar25->arg2 - 1);
            lVar21 = 0;
            do {
              iVar8 = number_range((int)lVar21,(int)uVar22);
              pEVar4 = pRVar15->exit[lVar21];
              pRVar15->exit[lVar21] = pRVar15->exit[iVar8];
              pRVar15->exit[iVar8] = pEVar4;
              lVar21 = lVar21 + 1;
              uVar22 = (long)pRVar25->arg2 - 1;
            } while (lVar21 < (long)uVar22);
          }
        }
        pRVar25 = pRVar25->next;
      } while (pRVar25 != (RESET_DATA *)0x0);
    }
  }
  return;
}

Assistant:

void reset_room(ROOM_INDEX_DATA *pRoom)
{
	RESET_DATA *pReset;
	CHAR_DATA *pMob;
	CHAR_DATA *mob;
	OBJ_DATA *pObj, *pObj2;
	CHAR_DATA *LastMob = nullptr;
	OBJ_DATA *LastObj = nullptr;
	EXIT_DATA *pexit = nullptr;
	bool last;
	int level = 0;
	char buf[MSL];
	CHAR_DATA *rch;
	bool found;

	if (!pRoom)
		return;

	pMob = nullptr;
	last = true;

	if (pRoom->trap)
		pRoom->trap->armed = true;

	for (pReset = pRoom->reset_first; pReset != nullptr; pReset = pReset->next)
	{
		ROOM_INDEX_DATA *pRoomIndex = nullptr;
		MOB_INDEX_DATA *pMobIndex = nullptr;
		OBJ_INDEX_DATA *pObjIndex = nullptr;
		OBJ_INDEX_DATA *pObjToIndex = nullptr;
		OBJ_DATA *secondary = nullptr;
		int count, limit;

		switch (pReset->command)
		{
			case 'M':
				pMobIndex = get_mob_index(pReset->arg1);

				if (pMobIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'M': bad vnum {}.", pReset->arg1);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'R': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pMobIndex->count >= pReset->arg2)
				{
					last= false;
					break;
				}

				count = 0;
				for (mob = pRoomIndex->people; mob != nullptr; mob = mob->next_in_room)
				{
					if (mob->pIndexData == pMobIndex)
					{
						count++;
						if (count >= pReset->arg4)
						{
							last= false;
							break;
						}
					}
				}

				if (count >= pReset->arg4)
					break;

				pMob = create_mobile(pMobIndex);

				/*
				* Some more hard coding.
				*/
				if (room_is_dark(pRoom))
					SET_BIT(pMob->affected_by, AFF_INFRARED);

				/*
				* Pet shop mobiles get ACT_PET set.
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoom->vnum - 1);
					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						SET_BIT(pMob->act, ACT_PET);
				}

				pMob->zone = pRoomIndex->area;

				char_to_room(pMob, pRoom);

				LastMob = pMob;
				level = URANGE(0, pMob->level - 2, LEVEL_HERO - 1); /* -1 ROM */
				last = true;
				break;
			case 'O':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 1 : bad vnum {}", pReset->arg1);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 2 : bad vnum {}.", pReset->arg3);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				for (pObj2 = pRoomIndex->contents; pObj2; pObj2 = pObj2->next_content)
				{
					if (pObj2->pIndexData->vnum == pObjIndex->vnum
						&& !is_obj_stat(pObj2, ITEM_DONATION_PIT)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_PC)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_NPC)
						&& pObj2->item_type == ITEM_CONTAINER
						&& !pObj2->contains)
					{
						extract_obj(pObj2);
					}
				}

				if ((pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					|| count_obj_list(pObjIndex, pRoomIndex->contents) > 0)
				{
					last= false;
					break;
				}

				pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
				pObj->cost = 0;
				pObj->owner = palloc_string("none");
				pObj->talked = palloc_string("someone a long long time ago");

				obj_to_room(pObj, pRoom);

				last = true;
				break;
			case 'P':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg1);
					continue;
				}

				pObjToIndex = get_obj_index(pReset->arg3);

				if (!pObjToIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pReset->arg2 > 50)
					limit = 6;
				else if (pReset->arg2 == -1)
					limit = 999;
				else
					limit = pReset->arg2;

				if (pRoom->area->nplayer > 1
					|| (LastObj = get_obj_type(pObjToIndex)) == nullptr
					|| (LastObj->in_room == nullptr && !last)
					|| (pObjIndex->limtotal > 0 && pObjIndex->limcount >= pObjIndex->limtotal)
					|| (pObjIndex->count >= limit /* && number_range(0,4) != 0 */)
					|| (count = count_obj_list(pObjIndex, LastObj->contains)) > pReset->arg4)
				{
					last= false;
					break;
				}

				while (count < pReset->arg4)
				{
					pObj = create_object(pObjIndex, number_fuzzy(LastObj->level));
					pObj->owner = palloc_string("none");
					obj_to_obj(pObj, LastObj);

					count++;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
						break;
				}

				LastObj->value[1] = LastObj->pIndexData->value[1];
				last = true;
				break;
			case 'G':
			case 'E':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': bad vnum {}.", pReset->arg1);
					continue;
				}

				if (!last)
					break;

				if (!LastMob)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': null mob for vnum {}.", pReset->arg1);
					last= false;
					break;
				}

				if (LastMob->pIndexData->pShop)
				{
					int olevel = 0, i, j;

					if (!pObjIndex->new_format)
					{
						switch (pObjIndex->item_type)
						{
							case ITEM_PILL:
							case ITEM_POTION:
							case ITEM_SCROLL:
								olevel = 53;
								for (i = 1; i < 5; i++)
								{
									if (pObjIndex->value[i] > 0)
									{
										for (j = 0; j < MAX_CLASS; j++)
										{
											olevel = std::min(olevel, (int)skill_table[pObjIndex->value[i]].skill_level[j]);
										}
									}
								}
								olevel = std::max(0, (olevel * 3 / 4) - 2);
								break;
							case ITEM_WAND:
								olevel = number_range(10, 20);
								break;
							case ITEM_STAFF:
								olevel = number_range(15, 25);
								break;
							case ITEM_ARMOR:
								olevel = number_range(5, 15);
								break;
							case ITEM_WEAPON:
								olevel = number_range(5, 15);
								break;
							case ITEM_TREASURE:
								olevel = number_range(10, 20);
								break;
							default:
								olevel = 0;
								break;
						}
					}

					pObj = create_object(pObjIndex, olevel);
					pObj->owner = palloc_string("none");

					if (pObj->pIndexData->limtotal == 0)
						SET_BIT(pObj->extra_flags, ITEM_INVENTORY);
				}
				else /* ROM OLC else version */
				{
					int limit;

					if (pReset->arg2 > 50) /* old format */
						limit = 6;
					else if (pReset->arg2 == -1 || pReset->arg2 == 0) /* no limit */
						limit = 999;
					else
						limit = pReset->arg2;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					{
						break;
					}
					else
					{
						pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
					}

					pObj->owner = palloc_string("none");
				}

				obj_to_char(pObj, LastMob);

				if (pReset->command == 'E')
				{
					if (pReset->arg3 == 16)
					{
						secondary = get_eq_char(LastMob, WEAR_WIELD);

						if (secondary != nullptr)
						{
							unequip_char(LastMob, secondary, true);
							equip_char(LastMob, secondary, 18, true);
							equip_char(LastMob, pObj, 16, true);
						}
						else
						{
							equip_char(LastMob, pObj, pReset->arg3, true);
						}
					}
					else if (pReset->arg3 == 18)
					{
						if (get_eq_char(LastMob, WEAR_WIELD) == nullptr)
							equip_char(LastMob, pObj, 16, true);
						else
							equip_char(LastMob, pObj, pReset->arg3, true);
					}
					else
					{
						equip_char(LastMob, pObj, pReset->arg3, true);
					}
				}
				last = true;
				break;

			case 'F':
				found= false;

				if (!LastMob)
					continue;

				for (rch = LastMob->in_room->people; rch != nullptr; rch = rch->next_in_room)
				{
					if (is_npc(rch) && (pReset->arg2 == rch->pIndexData->vnum))
					{
						found = true;
						break;
					}
				}

				if (!last || !found)
					break;

				add_follower(LastMob, rch);
				LastMob->leader = rch;
				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'D': bad vnum {}.", pReset->arg1);
					continue;
				}

				pexit = pRoomIndex->exit[pReset->arg2];

				if (pexit == nullptr)
					break;

				SET_BIT(pexit->exit_info, EX_ISDOOR);

				switch (pReset->arg3)
				{
					case 0:
						REMOVE_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
				}

				last = true;
				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'R': bad vnum {}.", pReset->arg1);
					continue;
				}

				{
					EXIT_DATA *pExit;
					int d0;
					int d1;

					for (d0 = 0; d0 < pReset->arg2 - 1; d0++)
					{
						d1 = number_range(d0, pReset->arg2 - 1);
						pExit = pRoomIndex->exit[d0];
						pRoomIndex->exit[d0] = pRoomIndex->exit[d1];
						pRoomIndex->exit[d1] = pExit;
					}
				}

				break;
			default:
				RS.Logger.Warn("Reset_area: bad command {}.", pReset->command);
				break;
		}
	}
}